

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testArgumentParser.cxx
# Opt level: O1

bool anon_unknown.dwarf_12f07::verifyResult
               (Result *result,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *unparsedArguments)

{
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar1;
  pointer pvVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  bool bVar3;
  __type _Var4;
  int iVar5;
  ostream *poVar6;
  const_iterator cVar7;
  _Rb_tree_node_base *p_Var8;
  long lVar9;
  pointer pbVar10;
  long *plVar11;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __l_08;
  initializer_list<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_233;
  allocator_type local_232;
  allocator_type local_231;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  long *local_1f0 [2];
  long local_1e0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  static_string_view local_1a0;
  undefined1 local_190 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  undefined1 local_160 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  char local_140 [16];
  undefined1 local_130 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0 [3];
  
  if (((anonymous_namespace)::
       verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::foobar_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::foobar_abi_cxx11_), iVar5 != 0)) {
    local_190._0_8_ = local_190 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"foo","");
    pbVar10 = (pointer)local_160;
    local_170._M_allocated_capacity = (size_type)pbVar10;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_190 + 0x20),"bar","");
    __l._M_len = 2;
    __l._M_array = (iterator)local_190;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&(anonymous_namespace)::
              verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
              ::foobar_abi_cxx11_,__l,(allocator_type *)&local_210);
    lVar9 = -0x40;
    do {
      if (pbVar10 != (pointer)pbVar10[-1].field_2._M_allocated_capacity) {
        operator_delete((pointer)pbVar10[-1].field_2._M_allocated_capacity,
                        (ulong)((pbVar10->_M_dataplus)._M_p + 1));
      }
      pbVar10 = pbVar10 + -1;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0);
    __cxa_atexit(std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~vector,
                 &(anonymous_namespace)::
                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                  ::foobar_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::foobar_abi_cxx11_);
  }
  if (((anonymous_namespace)::
       verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::barfoo_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::barfoo_abi_cxx11_), iVar5 != 0)) {
    local_190._0_8_ = local_190 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"bar","");
    pbVar10 = (pointer)local_160;
    local_170._M_allocated_capacity = (size_type)pbVar10;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_190 + 0x20),"foo","");
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)local_190;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&(anonymous_namespace)::
              verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
              ::barfoo_abi_cxx11_,__l_00,(allocator_type *)&local_210);
    lVar9 = -0x40;
    do {
      if (pbVar10 != (pointer)pbVar10[-1].field_2._M_allocated_capacity) {
        operator_delete((pointer)pbVar10[-1].field_2._M_allocated_capacity,
                        (ulong)((pbVar10->_M_dataplus)._M_p + 1));
      }
      pbVar10 = pbVar10 + -1;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0);
    __cxa_atexit(std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~vector,
                 &(anonymous_namespace)::
                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                  ::barfoo_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::barfoo_abi_cxx11_);
  }
  if (((anonymous_namespace)::
       verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::unbound_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::unbound_abi_cxx11_), iVar5 != 0)) {
    local_190._0_8_ = local_190 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"unbound","");
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)local_190;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&(anonymous_namespace)::
              verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
              ::unbound_abi_cxx11_,__l_01,(allocator_type *)&local_210);
    if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
      operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
    }
    __cxa_atexit(std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~vector,
                 &(anonymous_namespace)::
                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                  ::unbound_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::unbound_abi_cxx11_);
  }
  if (((anonymous_namespace)::
       verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::parsedKeywords == '\0') &&
     (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::parsedKeywords), iVar5 != 0)) {
    memcpy((iterator)local_190,&DAT_00bd7260,0x160);
    __l_02._M_len = 0x16;
    __l_02._M_array = (iterator)local_190;
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::vector(&verifyResult::parsedKeywords,__l_02,(allocator_type *)&local_210);
    __cxa_atexit(std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::~vector,&verifyResult::parsedKeywords,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::parsedKeywords);
  }
  if (((anonymous_namespace)::
       verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::func2map_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::func2map_abi_cxx11_), iVar5 != 0)) {
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"foo","");
    __l_03._M_len = 1;
    __l_03._M_array = &local_230;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1b8,__l_03,(allocator_type *)&local_1a0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pair<const_char_(&)[8],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_190,(char (*) [8])"FUNC_2a",&local_1b8);
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"bar","");
    plVar11 = local_1e0;
    local_1f0[0] = plVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"zot","");
    __l_04._M_len = 2;
    __l_04._M_array = &local_210;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1d0,__l_04,&local_232);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pair<const_char_(&)[8],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_160 + 8),(char (*) [8])"FUNC_2b",&local_1d0);
    __l_05._M_len = 2;
    __l_05._M_array = (iterator)local_190;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::map(&(anonymous_namespace)::
           verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
           ::func2map_abi_cxx11_,__l_05,&local_233,&local_231);
    lVar9 = 0x38;
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_190 + lVar9));
      lVar9 = lVar9 + -0x38;
    } while (lVar9 != -0x38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1d0);
    lVar9 = -0x40;
    do {
      if (plVar11 != (long *)plVar11[-2]) {
        operator_delete((long *)plVar11[-2],*plVar11 + 1);
      }
      plVar11 = plVar11 + -4;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    __cxa_atexit(std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::~map,&(anonymous_namespace)::
                         verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::func2map_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::func2map_abi_cxx11_);
  }
  if (((anonymous_namespace)::
       verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::func4map_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::func4map_abi_cxx11_), iVar5 != 0)) {
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"foo","");
    __l_06._M_len = 1;
    __l_06._M_array = &local_230;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1b8,__l_06,(allocator_type *)&local_1a0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pair<const_char_(&)[8],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_190,(char (*) [8])"FUNC_4a",&local_1b8);
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"bar","");
    plVar11 = local_1e0;
    local_1f0[0] = plVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"zot","");
    __l_07._M_len = 2;
    __l_07._M_array = &local_210;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1d0,__l_07,&local_232);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pair<const_char_(&)[8],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_160 + 8),(char (*) [8])"FUNC_4b",&local_1d0);
    __l_08._M_len = 2;
    __l_08._M_array = (iterator)local_190;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::map(&(anonymous_namespace)::
           verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
           ::func4map_abi_cxx11_,__l_08,&local_233,&local_231);
    lVar9 = 0x38;
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_190 + lVar9));
      lVar9 = lVar9 + -0x38;
    } while (lVar9 != -0x38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1d0);
    lVar9 = -0x40;
    do {
      if (plVar11 != (long *)plVar11[-2]) {
        operator_delete((long *)plVar11[-2],*plVar11 + 1);
      }
      plVar11 = plVar11 + -4;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    __cxa_atexit(std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::~map,&(anonymous_namespace)::
                         verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::func4map_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::func4map_abi_cxx11_);
  }
  if (((anonymous_namespace)::
       verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::keywordErrors_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::keywordErrors_abi_cxx11_), iVar5 != 0)) {
    local_210._M_dataplus._M_p = (pointer)0x8;
    local_210._M_string_length = 0x90458f;
    std::
    pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<cm::static_string_view,_const_char_(&)[26],_true>
              ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_190,(static_string_view *)&local_210,
               (char (*) [26])"  missing required value\n");
    local_230._M_dataplus._M_p = (pointer)0x8;
    local_230._M_string_length = 0x9045bc;
    std::
    pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<cm::static_string_view,_const_char_(&)[28],_true>
              ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_160,(static_string_view *)&local_230,
               (char (*) [28])"  empty string not allowed\n");
    local_1b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x6;
    local_1b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x9045c5;
    std::
    pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<cm::static_string_view,_const_char_(&)[26],_true>
              ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_130,(static_string_view *)&local_1b8,
               (char (*) [26])"  missing required value\n");
    local_1d0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x6;
    local_1d0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x9045da;
    std::
    pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<cm::static_string_view,_const_char_(&)[26],_true>
              (&local_100,(static_string_view *)&local_1d0,
               (char (*) [26])"  missing required value\n");
    local_1a0.super_string_view._M_len = 6;
    local_1a0.super_string_view._M_str = "FUNC_0";
    std::
    pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<cm::static_string_view,_const_char_(&)[26],_true>
              (local_d0,&local_1a0,(char (*) [26])"  missing required value\n");
    __l_09._M_len = 5;
    __l_09._M_array = (iterator)local_190;
    std::
    map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map(&(anonymous_namespace)::
           verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
           ::keywordErrors_abi_cxx11_,__l_09,
          (less<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_232,
          (allocator_type *)&local_233);
    lVar9 = -0xf0;
    paVar13 = &local_d0[0].second.field_2;
    do {
      if (paVar13 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar13->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar13->_M_allocated_capacity)[-2],
                        paVar13->_M_allocated_capacity + 1);
      }
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar13->_M_allocated_capacity + -6);
      lVar9 = lVar9 + 0x30;
    } while (lVar9 != 0);
    __cxa_atexit(std::
                 map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::~map,&(anonymous_namespace)::
                         verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::keywordErrors_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::keywordErrors_abi_cxx11_);
  }
  if (((anonymous_namespace)::
       verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::unparsed_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::unparsed_abi_cxx11_), iVar5 != 0)) {
    local_190._0_8_ = local_190 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"pos2","");
    local_170._M_allocated_capacity = (size_type)local_160;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_190 + 0x20),"bar","");
    local_150._M_allocated_capacity = (size_type)local_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"ign1","");
    local_130._0_8_ = local_130 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"ign2","");
    ppVar12 = &local_100;
    local_110._M_allocated_capacity = (size_type)ppVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_130 + 0x20),"ign4","");
    __l_10._M_len = 5;
    __l_10._M_array = (iterator)local_190;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&(anonymous_namespace)::
              verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
              ::unparsed_abi_cxx11_,__l_10,(allocator_type *)&local_210);
    lVar9 = -0xa0;
    do {
      ppVar1 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)ppVar12[-1].second.field_2._M_allocated_capacity;
      if (ppVar12 != ppVar1) {
        operator_delete(ppVar1,(ppVar12->first)._M_len + 1);
      }
      ppVar12 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&ppVar12[-1].second;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0);
    __cxa_atexit(std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~vector,
                 &(anonymous_namespace)::
                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                  ::unparsed_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::unparsed_abi_cxx11_);
  }
  if ((result->super_ParseResult).KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(!result) failed on line ",0x24);
    iVar5 = 0xbd;
  }
  else if (result->Option1 == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(result.Option1) failed on line ",0x2b);
    iVar5 = 0xbf;
  }
  else if (result->Option2 == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(!result.Option2) failed on line ",0x2c);
    iVar5 = 0xc0;
  }
  else if ((result->String1)._M_string_length == 0) {
    if ((result->String2).
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(result.String2) failed on line ",0x2b);
      iVar5 = 0xc3;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)&result->String2);
      if (iVar5 == 0) {
        if ((result->String3).
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == true) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"ASSERT_TRUE(!result.String3) failed on line ",0x2c);
          iVar5 = 0xc5;
        }
        else if ((result->String4).
                 super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>.
                 _M_string_length == 0) {
          iVar5 = std::__cxx11::string::compare((char *)&result->String5);
          if (iVar5 == 0) {
            if ((result->String6).
                super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>.
                _M_string_length == 0) {
              if ((result->List1).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  (result->List1).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                bVar3 = std::operator==(&(result->List2).
                                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ,&(anonymous_namespace)::
                                          verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                          ::foobar_abi_cxx11_);
                if (bVar3) {
                  if ((result->List3).
                      super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_engaged == false) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"ASSERT_TRUE(result.List3) failed on line ",
                               0x29);
                    iVar5 = 0xcc;
                  }
                  else {
                    bVar3 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&result->List3,
                                            &(anonymous_namespace)::
                                             verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                             ::barfoo_abi_cxx11_);
                    if (bVar3) {
                      if ((result->List4).
                          super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_engaged == false) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"ASSERT_TRUE(result.List4) failed on line "
                                   ,0x29);
                        iVar5 = 0xce;
                      }
                      else if (*(pointer *)
                                &(result->List4).
                                 super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_payload._M_value.
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               == *(pointer *)
                                   ((long)&(result->List4).
                                           super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                                           ._M_payload.
                                           super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                                           .
                                           super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                           ._M_payload._M_value.
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   + 8)) {
                        if ((result->List5).
                            super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_engaged == true) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "ASSERT_TRUE(!result.List5) failed on line ",0x2a);
                          iVar5 = 0xd0;
                        }
                        else if ((result->List6).
                                 super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_engaged == false) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "ASSERT_TRUE(result.List6) failed on line ",0x29);
                          iVar5 = 0xd1;
                        }
                        else if (*(pointer *)
                                  &(result->List6).
                                   super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   ._M_payload._M_value.
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 == *(pointer *)
                                     ((long)&(result->List6).
                                             super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                                             ._M_payload.
                                             super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                                             .
                                             super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                             ._M_payload._M_value.
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     + 8)) {
                          if ((result->Multi1).
                              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start ==
                              (result->Multi1).
                              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish) {
                            pvVar2 = (result->Multi2).
                                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                            if ((long)(result->Multi2).
                                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 ==
                                0x18) {
                              if ((pvVar2->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start ==
                                  *(pointer *)
                                   ((long)&(pvVar2->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data + 8)) {
                                if ((result->Multi3).
                                    super__Optional_base<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                    ._M_engaged == false) {
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,
                                             "ASSERT_TRUE(result.Multi3) failed on line ",0x2a);
                                  iVar5 = 0xd7;
                                }
                                else {
                                  __x = *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          **)&(result->Multi3).
                                              super__Optional_base<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_true,_false,_false>
                                              .
                                              super__Optional_payload_base<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                              ._M_payload._M_value.
                                              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                              ._M_impl;
                                  if ((long)*(pointer *)
                                             ((long)&(result->Multi3).
                                                                                                          
                                                  super__Optional_base<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                                  ._M_payload._M_value.
                                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                             + 8) - (long)__x == 0x30) {
                                    bVar3 = std::operator==(__x,&(anonymous_namespace)::
                                                                                                                                  
                                                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                                  ::foobar_abi_cxx11_);
                                    if (bVar3) {
                                      bVar3 = std::operator==((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)(*(long *)&(result->Multi3).
                                                                                                                              
                                                  super__Optional_base<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                                  ._M_payload._M_value.
                                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  ._M_impl + 0x18),
                                                  &(anonymous_namespace)::
                                                                                                      
                                                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                                  ::barfoo_abi_cxx11_);
                                      if (bVar3) {
                                        if ((result->Multi4).
                                            super__Optional_base<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                            ._M_engaged == true) {
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,
                                                     "ASSERT_TRUE(!result.Multi4) failed on line ",
                                                     0x2b);
                                          iVar5 = 0xdb;
                                        }
                                        else if (((result->Pos0).
                                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ._M_engaged == true) &&
                                                (iVar5 = std::__cxx11::string::compare
                                                                   ((char *)&result->Pos0),
                                                iVar5 == 0)) {
                                          if ((result->Pos1).
                                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                              .
                                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ._M_engaged == true) {
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      ((ostream *)&std::cout,
                                                       "ASSERT_TRUE(!result.Pos1) failed on line ",
                                                       0x29);
                                            iVar5 = 0xde;
                                          }
                                          else if ((result->Pos2).
                                                                                                      
                                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ._M_engaged == true) {
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      ((ostream *)&std::cout,
                                                       "ASSERT_TRUE(!result.Pos2) failed on line ",
                                                       0x29);
                                            iVar5 = 0xdf;
                                          }
                                          else if (result->Func0_ == false) {
                                            iVar5 = std::__cxx11::string::compare
                                                              ((char *)&result->Func1_);
                                            if (iVar5 == 0) {
                                              if (((result->Func2_)._M_t._M_impl.
                                                   super__Rb_tree_header._M_node_count ==
                                                   (anonymous_namespace)::
                                                                                                      
                                                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                                  ::func2map_abi_cxx11_._M_t._M_impl.
                                                  super__Rb_tree_header._M_node_count) &&
                                                 (bVar3 = std::__equal<false>::
                                                                                                                    
                                                  equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                                                            ((result->Func2_)._M_t._M_impl.
                                                             super__Rb_tree_header._M_header._M_left
                                                             ,(
                                                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  )&(result->Func2_)._M_t._M_impl.
                                                    super__Rb_tree_header,
                                                  (
                                                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  )(anonymous_namespace)::
                                                                                                      
                                                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                                  ::func2map_abi_cxx11_._M_t._M_impl.
                                                  super__Rb_tree_header._M_header._M_left), bVar3))
                                              {
                                                bVar3 = std::operator==(&result->Func3_,
                                                                        &(anonymous_namespace)::
                                                                                                                                                  
                                                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                                  ::foobar_abi_cxx11_);
                                                if (bVar3) {
                                                  if (((result->Func4_)._M_t._M_impl.
                                                       super__Rb_tree_header._M_node_count ==
                                                       (anonymous_namespace)::
                                                                                                              
                                                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                                  ::func4map_abi_cxx11_._M_t._M_impl.
                                                  super__Rb_tree_header._M_node_count) &&
                                                  (bVar3 = std::__equal<false>::
                                                                                                                      
                                                  equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                                                            ((result->Func4_)._M_t._M_impl.
                                                             super__Rb_tree_header._M_header._M_left
                                                             ,(
                                                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  )&(result->Func4_)._M_t._M_impl.
                                                    super__Rb_tree_header,
                                                  (
                                                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  )(anonymous_namespace)::
                                                                                                      
                                                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                                  ::func4map_abi_cxx11_._M_t._M_impl.
                                                  super__Rb_tree_header._M_header._M_left), bVar3))
                                                  {
                                                    bVar3 = std::operator==(unparsedArguments,
                                                                            &(anonymous_namespace)::
                                                                                                                                                          
                                                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                                  ::unparsed_abi_cxx11_);
                                                  if (bVar3) {
                                                    iVar5 = std::__cxx11::string::compare
                                                                      ((char *)&result->UnboundMaybe
                                                                      );
                                                    if (iVar5 == 0) {
                                                      bVar3 = std::operator==(&(result->
                                                  UnboundMaybeEmpty).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ,&(anonymous_namespace)::
                                                                                                        
                                                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                                  ::unbound_abi_cxx11_);
                                                  if (bVar3) {
                                                    bVar3 = std::operator==(&(result->
                                                  UnboundNonEmpty).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ,&(anonymous_namespace)::
                                                                                                        
                                                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                                  ::unbound_abi_cxx11_);
                                                  if (bVar3) {
                                                    iVar5 = std::__cxx11::string::compare
                                                                      ((char *)&result->
                                                  UnboundNonEmptyStr);
                                                  if (iVar5 == 0) {
                                                    bVar3 = std::operator==(&result->ParsedKeywords,
                                                                            &verifyResult::
                                                                             parsedKeywords);
                                                    if (bVar3) {
                                                      if ((result->super_ParseResult).KeywordErrors.
                                                          _M_t._M_impl.super__Rb_tree_header.
                                                          _M_node_count ==
                                                          (anonymous_namespace)::
                                                                                                                    
                                                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                                  ::keywordErrors_abi_cxx11_._M_t._M_impl.
                                                  super__Rb_tree_header._M_node_count) {
                                                    p_Var8 = (result->super_ParseResult).
                                                             KeywordErrors._M_t._M_impl.
                                                             super__Rb_tree_header._M_header._M_left
                                                    ;
                                                    while( true ) {
                                                      bVar3 = (_Rb_tree_header *)p_Var8 ==
                                                              &(result->super_ParseResult).
                                                               KeywordErrors._M_t._M_impl.
                                                               super__Rb_tree_header;
                                                      if (bVar3) {
                                                        return bVar3;
                                                      }
                                                      cVar7 = std::
                                                  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::find(&(anonymous_namespace)::
                                                                                                                    
                                                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                                  ::keywordErrors_abi_cxx11_._M_t,
                                                  (key_type *)(p_Var8 + 1));
                                                  if ((_Rb_tree_header *)cVar7._M_node ==
                                                      &(anonymous_namespace)::
                                                                                                              
                                                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                                  ::keywordErrors_abi_cxx11_._M_t._M_impl.
                                                  super__Rb_tree_header) break;
                                                  _Var4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&p_Var8[1]._M_left,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&cVar7._M_node[1]._M_left);
                                                  if (!_Var4) {
                                                    std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                                                                                          
                                                  "ASSERT_TRUE(ke.second == ki->second) failed on line "
                                                  ,0x34);
                                                  iVar5 = 0xf4;
                                                  goto LAB_001a2a3b;
                                                  }
                                                  p_Var8 = (_Rb_tree_node_base *)
                                                           std::_Rb_tree_increment(p_Var8);
                                                  }
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                                                                                          
                                                  "ASSERT_TRUE(ki != keywordErrors.end()) failed on line "
                                                  ,0x36);
                                                  iVar5 = 0xf3;
                                                  goto LAB_001a2a3b;
                                                  }
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                                                                                          
                                                  "ASSERT_TRUE(result.GetKeywordErrors().size() == keywordErrors.size()) failed on line "
                                                  ,0x55);
                                                  iVar5 = 0xf0;
                                                  }
                                                  else {
                                                    std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                                                                                          
                                                  "ASSERT_TRUE(result.ParsedKeywords == parsedKeywords) failed on line "
                                                  ,0x44);
                                                  iVar5 = 0xee;
                                                  }
                                                  }
                                                  else {
                                                    std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                                                                                          
                                                  "ASSERT_TRUE(result.UnboundNonEmptyStr == \"unbound\") failed on line "
                                                  ,0x43);
                                                  iVar5 = 0xec;
                                                  }
                                                  }
                                                  else {
                                                    std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                                                                                          
                                                  "ASSERT_TRUE(result.UnboundNonEmpty == unbound) failed on line "
                                                  ,0x3e);
                                                  iVar5 = 0xeb;
                                                  }
                                                  }
                                                  else {
                                                    std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                                                                                          
                                                  "ASSERT_TRUE(result.UnboundMaybeEmpty == unbound) failed on line "
                                                  ,0x40);
                                                  iVar5 = 0xea;
                                                  }
                                                  }
                                                  else {
                                                    std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                                                                                          
                                                  "ASSERT_TRUE(result.UnboundMaybe == \"unbound\") failed on line "
                                                  ,0x3d);
                                                  iVar5 = 0xe9;
                                                  }
                                                  }
                                                  else {
                                                    std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                                                                                          
                                                  "ASSERT_TRUE(unparsedArguments == unparsed) failed on line "
                                                  ,0x3a);
                                                  iVar5 = 0xe7;
                                                  }
                                                  }
                                                  else {
                                                    std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                                                                                          
                                                  "ASSERT_TRUE(result.Func4_ == func4map) failed on line "
                                                  ,0x36);
                                                  iVar5 = 0xe5;
                                                  }
                                                }
                                                else {
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                                                                                          
                                                  "ASSERT_TRUE(result.Func3_ == foobar) failed on line "
                                                  ,0x34);
                                                  iVar5 = 0xe4;
                                                }
                                              }
                                              else {
                                                std::__ostream_insert<char,std::char_traits<char>>
                                                          ((ostream *)&std::cout,
                                                                                                                      
                                                  "ASSERT_TRUE(result.Func2_ == func2map) failed on line "
                                                  ,0x36);
                                                iVar5 = 0xe3;
                                              }
                                            }
                                            else {
                                              std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,
                                                                                                                  
                                                  "ASSERT_TRUE(result.Func1_ == \"foo\") failed on line "
                                                  ,0x33);
                                              iVar5 = 0xe2;
                                            }
                                          }
                                          else {
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      ((ostream *)&std::cout,
                                                                                                              
                                                  "ASSERT_TRUE(result.Func0_ == false) failed on line "
                                                  ,0x33);
                                            iVar5 = 0xe1;
                                          }
                                        }
                                        else {
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,
                                                                                                          
                                                  "ASSERT_TRUE(result.Pos0 == \"pos0\") failed on line "
                                                  ,0x32);
                                          iVar5 = 0xdd;
                                        }
                                      }
                                      else {
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,
                                                                                                      
                                                  "ASSERT_TRUE((*result.Multi3)[1] == barfoo) failed on line "
                                                  ,0x3a);
                                        iVar5 = 0xda;
                                      }
                                    }
                                    else {
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,
                                                 "ASSERT_TRUE((*result.Multi3)[0] == foobar) failed on line "
                                                 ,0x3a);
                                      iVar5 = 0xd9;
                                    }
                                  }
                                  else {
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,
                                               "ASSERT_TRUE((*result.Multi3).size() == 2) failed on line "
                                               ,0x39);
                                    iVar5 = 0xd8;
                                  }
                                }
                              }
                              else {
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,
                                           "ASSERT_TRUE(result.Multi2[0].empty()) failed on line ",
                                           0x35);
                                iVar5 = 0xd6;
                              }
                            }
                            else {
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,
                                         "ASSERT_TRUE(result.Multi2.size() == 1) failed on line ",
                                         0x36);
                              iVar5 = 0xd5;
                            }
                          }
                          else {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,
                                       "ASSERT_TRUE(result.Multi1.empty()) failed on line ",0x32);
                            iVar5 = 0xd4;
                          }
                        }
                        else {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "ASSERT_TRUE(result.List6->empty()) failed on line ",0x32);
                          iVar5 = 0xd2;
                        }
                      }
                      else {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "ASSERT_TRUE(result.List4->empty()) failed on line ",0x32);
                        iVar5 = 0xcf;
                      }
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "ASSERT_TRUE(*result.List3 == barfoo) failed on line ",0x34);
                      iVar5 = 0xcd;
                    }
                  }
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "ASSERT_TRUE(result.List2 == foobar) failed on line ",0x33);
                  iVar5 = 0xcb;
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"ASSERT_TRUE(result.List1.empty()) failed on line "
                           ,0x31);
                iVar5 = 0xca;
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"ASSERT_TRUE(result.String6.empty()) failed on line "
                         ,0x33);
              iVar5 = 200;
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "ASSERT_TRUE(result.String5 == \"foo\") failed on line ",0x34);
            iVar5 = 199;
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"ASSERT_TRUE(result.String4.empty()) failed on line ",
                     0x33);
          iVar5 = 0xc6;
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ASSERT_TRUE(*result.String2 == \"foo\") failed on line ",
                   0x35);
        iVar5 = 0xc4;
      }
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(result.String1.empty()) failed on line ",0x33);
    iVar5 = 0xc2;
  }
  bVar3 = false;
LAB_001a2a3b:
  poVar6 = (ostream *)std::ostream::operator<<(&std::cout,iVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  return bVar3;
}

Assistant:

bool verifyResult(Result const& result,
                  std::vector<std::string> const& unparsedArguments)
{
  static std::vector<std::string> const foobar = { "foo", "bar" };
  static std::vector<std::string> const barfoo = { "bar", "foo" };
  static std::vector<std::string> const unbound = { "unbound" };
  static std::vector<cm::string_view> const parsedKeywords = {
    /* clang-format off */
    "OPTION_1",
    "STRING_1",
    "STRING_2",
    "STRING_4",
    "STRING_5",
    "STRING_6",
    "LIST_1",
    "LIST_2",
    "LIST_3",
    "LIST_3",
    "LIST_4",
    "LIST_6",
    "MULTI_2",
    "MULTI_3",
    "MULTI_3",
    "FUNC_0",
    "FUNC_1",
    "FUNC_2a",
    "FUNC_2b",
    "FUNC_3",
    "FUNC_4a",
    "FUNC_4b",
    /* clang-format on */
  };
  static std::map<std::string, std::vector<std::string>> const func2map = {
    { "FUNC_2a", { "foo" } }, { "FUNC_2b", { "bar", "zot" } }
  };
  static std::map<std::string, std::vector<std::string>> const func4map = {
    { "FUNC_4a", { "foo" } }, { "FUNC_4b", { "bar", "zot" } }
  };
  static std::map<cm::string_view, std::string> const keywordErrors = {
    { "STRING_1"_s, "  missing required value\n" },
    { "STRING_6"_s, "  empty string not allowed\n" },
    { "LIST_1"_s, "  missing required value\n" },
    { "LIST_4"_s, "  missing required value\n" },
    { "FUNC_0"_s, "  missing required value\n" }
  };
  static std::vector<std::string> const unparsed = { "pos2", "bar", "ign1",
                                                     "ign2", "ign4" };

#define ASSERT_TRUE(x)                                                        \
  do {                                                                        \
    if (!(x)) {                                                               \
      std::cout << "ASSERT_TRUE(" #x ") failed on line " << __LINE__ << "\n"; \
      return false;                                                           \
    }                                                                         \
  } while (false)

  ASSERT_TRUE(!result);

  ASSERT_TRUE(result.Option1);
  ASSERT_TRUE(!result.Option2);

  ASSERT_TRUE(result.String1.empty());
  ASSERT_TRUE(result.String2);
  ASSERT_TRUE(*result.String2 == "foo");
  ASSERT_TRUE(!result.String3);
  ASSERT_TRUE(result.String4.empty());
  ASSERT_TRUE(result.String5 == "foo");
  ASSERT_TRUE(result.String6.empty());

  ASSERT_TRUE(result.List1.empty());
  ASSERT_TRUE(result.List2 == foobar);
  ASSERT_TRUE(result.List3);
  ASSERT_TRUE(*result.List3 == barfoo);
  ASSERT_TRUE(result.List4);
  ASSERT_TRUE(result.List4->empty());
  ASSERT_TRUE(!result.List5);
  ASSERT_TRUE(result.List6);
  ASSERT_TRUE(result.List6->empty());

  ASSERT_TRUE(result.Multi1.empty());
  ASSERT_TRUE(result.Multi2.size() == 1);
  ASSERT_TRUE(result.Multi2[0].empty());
  ASSERT_TRUE(result.Multi3);
  ASSERT_TRUE((*result.Multi3).size() == 2);
  ASSERT_TRUE((*result.Multi3)[0] == foobar);
  ASSERT_TRUE((*result.Multi3)[1] == barfoo);
  ASSERT_TRUE(!result.Multi4);

  ASSERT_TRUE(result.Pos0 == "pos0");
  ASSERT_TRUE(!result.Pos1);
  ASSERT_TRUE(!result.Pos2);

  ASSERT_TRUE(result.Func0_ == false);
  ASSERT_TRUE(result.Func1_ == "foo");
  ASSERT_TRUE(result.Func2_ == func2map);
  ASSERT_TRUE(result.Func3_ == foobar);
  ASSERT_TRUE(result.Func4_ == func4map);

  ASSERT_TRUE(unparsedArguments == unparsed);

  ASSERT_TRUE(result.UnboundMaybe == "unbound");
  ASSERT_TRUE(result.UnboundMaybeEmpty == unbound);
  ASSERT_TRUE(result.UnboundNonEmpty == unbound);
  ASSERT_TRUE(result.UnboundNonEmptyStr == "unbound");

  ASSERT_TRUE(result.ParsedKeywords == parsedKeywords);

  ASSERT_TRUE(result.GetKeywordErrors().size() == keywordErrors.size());
  for (auto const& ke : result.GetKeywordErrors()) {
    auto const ki = keywordErrors.find(ke.first);
    ASSERT_TRUE(ki != keywordErrors.end());
    ASSERT_TRUE(ke.second == ki->second);
  }

  return true;
}